

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptor
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  allocator<char> local_59;
  Descriptor *local_58;
  string local_50;
  
  lVar3 = 0;
  local_58 = containing_descriptor;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x38); lVar2 = lVar2 + 1) {
    FixForeignFieldsInDescriptor
              (this,(Descriptor *)(*(long *)(descriptor + 0x40) + lVar3),descriptor);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x2c); lVar2 = lVar2 + 1) {
    lVar1 = *(long *)(descriptor + 0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"fields_by_name",&local_59);
    FixForeignFieldsInField(this,descriptor,(FieldDescriptor *)(lVar1 + lVar3),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 0x78;
  }
  FixContainingTypeInDescriptor<google::protobuf::Descriptor>(this,descriptor,local_58);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x48); lVar2 = lVar2 + 1) {
    FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
              (this,(EnumDescriptor *)(*(long *)(descriptor + 0x50) + lVar3),descriptor);
    lVar3 = lVar3 + 0x38;
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptor(
    const Descriptor& descriptor,
    const Descriptor* containing_descriptor) const {
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*descriptor.nested_type(i), &descriptor);
  }

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field_descriptor = *descriptor.field(i);
    FixForeignFieldsInField(&descriptor, field_descriptor, "fields_by_name");
  }

  FixContainingTypeInDescriptor(descriptor, containing_descriptor);
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *descriptor.enum_type(i);
    FixContainingTypeInDescriptor(enum_descriptor, &descriptor);
  }
}